

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O0

Value __thiscall
MiniScript::Parser::ParseNot(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  ParseState *this_00;
  bool bVar1;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  byte in_R8B;
  Value VVar2;
  code *local_1d8;
  code *local_1b0;
  Lexer local_170;
  Value local_168;
  Value local_158;
  Value local_148;
  Value local_138;
  Value local_128;
  TACLine local_118;
  int local_b4;
  int tempNum;
  Value local_a8;
  Lexer local_98;
  Token local_90;
  undefined1 local_59;
  undefined1 local_58 [8];
  Token tok;
  offset_in_Parser_to_subr nextLevel;
  bool statementStart_local;
  bool asLval_local;
  Lexer *tokens_local;
  Parser *this_local;
  Value *val;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  tok._24_8_ = ParseIsA;
  Lexer::Peek((Token *)local_58,this_01);
  local_59 = 0;
  Value::Value((Value *)this);
  if ((local_58._0_4_ == Keyword) && (bVar1 = String::operator==((String *)&tok,"not"), bVar1)) {
    Lexer::Dequeue(&local_90,this_01);
    Token::~Token(&local_90);
    Lexer::Lexer(&local_98,this_01);
    AllowLineBreak(&local_98);
    Lexer::~Lexer(&local_98);
    if ((tok._24_8_ & 1) == 0) {
      local_1b0 = (code *)tok._24_8_;
    }
    else {
      local_1b0 = *(code **)((long)tokens->ls + tok._24_8_ + -1);
    }
    Lexer::Lexer((Lexer *)&stack0xffffffffffffff50,this_01);
    (*local_1b0)(&local_a8,tokens,&stack0xffffffffffffff50,0);
    Value::operator=((Value *)this,&local_a8);
    Value::~Value(&local_a8);
    Lexer::~Lexer((Lexer *)&stack0xffffffffffffff50);
    local_b4 = *(int *)&((tokens[6].ls)->pending).ls;
    *(int *)&((tokens[6].ls)->pending).ls = local_b4 + 1;
    this_00 = (ParseState *)tokens[6].ls;
    Value::Temp(&local_128,local_b4);
    Value::Value(&local_138,(Value *)this);
    Value::Value(&local_148,(Value *)Value::null);
    TACLine::TACLine(&local_118,&local_128,NotA,&local_138,&local_148);
    ParseState::Add(this_00,&local_118);
    TACLine::~TACLine(&local_118);
    Value::~Value(&local_148);
    Value::~Value(&local_138);
    Value::~Value(&local_128);
    Value::Temp(&local_158,local_b4);
    Value::operator=((Value *)this,&local_158);
    Value::~Value(&local_158);
  }
  else {
    if ((tok._24_8_ & 1) == 0) {
      local_1d8 = (code *)tok._24_8_;
    }
    else {
      local_1d8 = *(code **)((long)tokens->ls + tok._24_8_ + -1);
    }
    Lexer::Lexer(&local_170,this_01);
    (*local_1d8)(&local_168,tokens,&local_170,statementStart,in_R8B & 1);
    Value::operator=((Value *)this,&local_168);
    Value::~Value(&local_168);
    Lexer::~Lexer(&local_170);
  }
  local_59 = 1;
  Token::~Token((Token *)local_58);
  VVar2.data.number = extraout_RDX.number;
  VVar2._0_8_ = this;
  return VVar2;
}

Assistant:

Value Parser::ParseNot(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseIsA;
		Token tok = tokens.Peek();
		Value val;
		if (tok.type == Token::Type::Keyword and tok.text == "not") {
			tokens.Dequeue();		// discard "not"

			AllowLineBreak(tokens); // allow a line break after a unary operator
			
			val = (*this.*nextLevel)(tokens, false, false);
			int tempNum = output->nextTempNum++;
			output->Add(TACLine(Value::Temp(tempNum), TACLine::Op::NotA, val));
			val = Value::Temp(tempNum);
		} else {
			val = (*this.*nextLevel)(tokens, asLval, statementStart);
		}
		return val;
	}